

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  short *psVar2;
  ushort *puVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  short sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  parasail_result_t *ppVar16;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  uint uVar17;
  uint uVar18;
  undefined2 uVar19;
  __m128i *palVar20;
  int32_t segNum;
  long lVar21;
  long lVar22;
  int16_t iVar23;
  uint uVar24;
  uint uVar25;
  ulong size;
  long lVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  undefined4 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  ulong uVar48;
  short sVar49;
  __m128i alVar50;
  undefined1 auVar51 [16];
  short sVar52;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ushort uVar62;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  short sVar71;
  short sVar79;
  short sVar80;
  short sVar81;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  __m128i_16_t e;
  __m128i_16_t h;
  int local_124;
  int local_110;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar35;
  short sVar41;
  short sVar43;
  short sVar46;
  undefined1 auVar75 [16];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar27 = (ulong)(uint)s2Len;
        uVar18 = profile->s1Len;
        if ((int)uVar18 < 1) {
          parasail_sg_flags_table_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_scan_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_scan_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_scan_profile_sse2_128_16_cold_1();
        }
        else {
          iVar12 = uVar18 - 1;
          uVar48 = (ulong)uVar18 + 7;
          size = uVar48 >> 3;
          uVar24 = (uint)size;
          iVar13 = iVar12 / (int)uVar24;
          iVar33 = -open;
          iVar29 = ppVar5->min;
          iVar28 = -iVar29;
          if (iVar29 != iVar33 && SBORROW4(iVar29,iVar33) == iVar29 + open < 0) {
            iVar28 = open;
          }
          iVar11 = ppVar5->max;
          ppVar16 = parasail_result_new_table1((uint)uVar48 & 0x7ffffff8,s2Len);
          if (ppVar16 != (parasail_result_t *)0x0) {
            ppVar16->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar16->flag | 0x8220402;
            ptr = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,size);
            ptr_02 = parasail_memalign___m128i(0x10,size);
            ptr_03 = parasail_memalign___m128i(0x10,size);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int16_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar14 = s2Len + -1;
              uVar15 = 7 - iVar13;
              auVar37 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar36 = auVar37._0_4_;
              auVar47._4_4_ = uVar36;
              auVar47._0_4_ = uVar36;
              auVar47._8_4_ = uVar36;
              auVar47._12_4_ = uVar36;
              auVar37 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar36 = auVar37._0_4_;
              uVar17 = iVar28 - 0x7fff;
              auVar38 = pshuflw(ZEXT416(uVar17),ZEXT416(uVar17),0);
              auVar39._0_4_ = auVar38._0_4_;
              auVar39._4_4_ = auVar39._0_4_;
              auVar39._8_4_ = auVar39._0_4_;
              auVar39._12_4_ = auVar39._0_4_;
              auVar37 = ZEXT416(CONCAT22((short)((uint)iVar29 >> 0x10),0x7ffe - (short)iVar11));
              auVar42 = pshuflw(auVar37,auVar37,0);
              auVar37._0_4_ = auVar42._0_4_;
              auVar37._4_4_ = auVar37._0_4_;
              auVar37._8_4_ = auVar37._0_4_;
              auVar37._12_4_ = auVar37._0_4_;
              auVar44 = pshuflw(ZEXT416(uVar15),ZEXT416(uVar15),0);
              sVar49 = auVar44._0_2_;
              sVar35 = auVar44._2_2_;
              auVar44 = pshuflw(ZEXT416(-(uVar24 * gap)),ZEXT416(-(uVar24 * gap)),0);
              uVar25 = auVar44._0_4_;
              auVar44._0_8_ = CONCAT44(uVar25,uVar25);
              auVar44._8_4_ = uVar25;
              auVar44._12_4_ = uVar25;
              auVar67._0_8_ = auVar44._0_8_ << 0x10;
              auVar67._8_8_ = auVar44._8_8_ << 0x10 | (ulong)(uVar25 >> 0x10);
              auVar44 = paddsw(auVar67,ZEXT416(uVar17 & 0xffff));
              lVar26 = (long)iVar33;
              uVar30 = 0;
              do {
                lVar21 = 0;
                lVar32 = lVar26;
                do {
                  lVar34 = lVar32;
                  if (s1_beg != 0) {
                    lVar34 = 0;
                  }
                  uVar19 = 0x8000;
                  if (-0x8000 < lVar34) {
                    uVar19 = (undefined2)lVar34;
                  }
                  *(undefined2 *)((long)&local_48 + lVar21 * 2) = uVar19;
                  lVar34 = lVar34 - (ulong)(uint)open;
                  if (lVar34 < -0x7fff) {
                    lVar34 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar21 * 2) = (short)lVar34;
                  lVar21 = lVar21 + 1;
                  lVar32 = lVar32 - size * (uint)gap;
                } while (lVar21 != 8);
                ptr_02[uVar30][0] = local_48;
                ptr_02[uVar30][1] = lStack_40;
                ptr[uVar30][0] = local_58;
                ptr[uVar30][1] = lStack_50;
                uVar30 = uVar30 + 1;
                lVar26 = lVar26 - (ulong)(uint)gap;
              } while (uVar30 != size);
              *ptr_00 = 0;
              uVar30 = 1;
              do {
                iVar23 = -0x8000;
                if (-0x8000 < iVar33) {
                  iVar23 = (int16_t)iVar33;
                }
                if (s2_beg != 0) {
                  iVar23 = 0;
                }
                ptr_00[uVar30] = iVar23;
                uVar30 = uVar30 + 1;
                iVar33 = iVar33 - gap;
              } while (s2Len + 1 != uVar30);
              alVar50 = (__m128i)psubsw((undefined1  [16])0x0,auVar47);
              palVar20 = ptr_03 + (uVar24 - 1);
              uVar30 = size;
              do {
                *palVar20 = alVar50;
                auVar64._4_4_ = uVar36;
                auVar64._0_4_ = uVar36;
                auVar64._8_4_ = uVar36;
                auVar64._12_4_ = uVar36;
                alVar50 = (__m128i)psubsw((undefined1  [16])alVar50,auVar64);
                sVar41 = (short)alVar50[0];
                sVar43 = auVar37._0_2_;
                auVar45._0_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar50[0]._2_2_;
                sVar43 = auVar37._2_2_;
                auVar45._2_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar50[0]._4_2_;
                sVar43 = auVar37._4_2_;
                auVar45._4_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar50[0]._6_2_;
                sVar43 = auVar37._6_2_;
                auVar45._6_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = (short)alVar50[1];
                sVar43 = auVar37._8_2_;
                auVar45._8_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar50[1]._2_2_;
                sVar43 = auVar37._10_2_;
                auVar45._10_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar50[1]._4_2_;
                sVar43 = auVar37._12_2_;
                sVar46 = auVar37._14_2_;
                auVar45._12_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar50[1]._6_2_;
                auVar45._14_2_ =
                     (ushort)(sVar41 < sVar46) * sVar41 | (ushort)(sVar41 >= sVar46) * sVar46;
                palVar20 = palVar20 + -1;
                iVar29 = (int)uVar30;
                uVar25 = iVar29 - 1;
                uVar30 = (ulong)uVar25;
                auVar37 = auVar45;
              } while (uVar25 != 0 && 0 < iVar29);
              palVar20 = ptr_02 + (uint)(iVar12 % (int)uVar24);
              uVar30 = 1;
              if (1 < s2Len) {
                uVar30 = uVar27;
              }
              lVar21 = (ulong)(uVar24 + (uVar24 == 0)) << 4;
              lVar32 = size * uVar27;
              lVar26 = 0;
              uVar31 = 0;
              auVar51 = auVar39;
              auVar53 = auVar39;
              local_124 = iVar14;
              do {
                uVar1 = ptr_02[uVar24 - 1][0];
                auVar82._8_8_ = ptr_02[uVar24 - 1][1] << 0x10 | uVar1 >> 0x30;
                auVar82._0_8_ = uVar1 << 0x10 | (ulong)(ushort)ptr_00[uVar31];
                iVar29 = ppVar5->mapper[(byte)s2[uVar31]];
                auVar63 = psubsw(auVar39,(undefined1  [16])*ptr_03);
                lVar34 = 0;
                auVar37 = auVar39;
                do {
                  auVar67 = *(undefined1 (*) [16])((long)*ptr_02 + lVar34);
                  auVar82 = paddsw(auVar82,*(undefined1 (*) [16])
                                            ((long)pvVar4 + lVar34 + (long)iVar29 * size * 0x10));
                  auVar64 = paddsw(auVar63,*(undefined1 (*) [16])((long)*ptr_03 + lVar34));
                  auVar8._4_4_ = uVar36;
                  auVar8._0_4_ = uVar36;
                  auVar8._8_4_ = uVar36;
                  auVar8._12_4_ = uVar36;
                  auVar63 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar34),auVar8);
                  sVar41 = auVar64._0_2_;
                  sVar43 = auVar37._0_2_;
                  auVar72._0_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar64._2_2_;
                  sVar43 = auVar37._2_2_;
                  auVar72._2_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar64._4_2_;
                  sVar43 = auVar37._4_2_;
                  auVar72._4_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar64._6_2_;
                  sVar43 = auVar37._6_2_;
                  auVar72._6_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar64._8_2_;
                  sVar43 = auVar37._8_2_;
                  auVar72._8_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar64._10_2_;
                  sVar43 = auVar37._10_2_;
                  auVar72._10_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar64._12_2_;
                  sVar43 = auVar37._12_2_;
                  sVar46 = auVar37._14_2_;
                  auVar72._12_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar64._14_2_;
                  auVar72._14_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  auVar37 = psubsw(auVar67,auVar47);
                  sVar41 = auVar63._0_2_;
                  sVar43 = auVar37._0_2_;
                  uVar83 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar63._2_2_;
                  sVar43 = auVar37._2_2_;
                  uVar84 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar63._4_2_;
                  sVar43 = auVar37._4_2_;
                  uVar85 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar63._6_2_;
                  sVar43 = auVar37._6_2_;
                  uVar86 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar63._8_2_;
                  sVar43 = auVar37._8_2_;
                  uVar87 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar63._10_2_;
                  sVar43 = auVar37._10_2_;
                  uVar88 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar63._12_2_;
                  sVar43 = auVar37._12_2_;
                  sVar46 = auVar37._14_2_;
                  uVar89 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar63._14_2_;
                  uVar90 = (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar82._0_2_;
                  uVar62 = (sVar41 < (short)uVar83) * uVar83 |
                           (ushort)(sVar41 >= (short)uVar83) * sVar41;
                  sVar41 = auVar82._2_2_;
                  uVar68 = (sVar41 < (short)uVar84) * uVar84 |
                           (ushort)(sVar41 >= (short)uVar84) * sVar41;
                  sVar41 = auVar82._4_2_;
                  uVar69 = (sVar41 < (short)uVar85) * uVar85 |
                           (ushort)(sVar41 >= (short)uVar85) * sVar41;
                  sVar41 = auVar82._6_2_;
                  uVar70 = (sVar41 < (short)uVar86) * uVar86 |
                           (ushort)(sVar41 >= (short)uVar86) * sVar41;
                  auVar63._0_8_ = CONCAT26(uVar70,CONCAT24(uVar69,CONCAT22(uVar68,uVar62)));
                  sVar41 = auVar82._8_2_;
                  auVar63._8_2_ =
                       (sVar41 < (short)uVar87) * uVar87 |
                       (ushort)(sVar41 >= (short)uVar87) * sVar41;
                  sVar41 = auVar82._10_2_;
                  auVar63._10_2_ =
                       (sVar41 < (short)uVar88) * uVar88 |
                       (ushort)(sVar41 >= (short)uVar88) * sVar41;
                  sVar41 = auVar82._12_2_;
                  sVar43 = auVar82._14_2_;
                  auVar63._12_2_ =
                       (sVar41 < (short)uVar89) * uVar89 |
                       (ushort)(sVar41 >= (short)uVar89) * sVar41;
                  auVar63._14_2_ =
                       (sVar43 < (short)uVar90) * uVar90 |
                       (ushort)(sVar43 >= (short)uVar90) * sVar43;
                  puVar3 = (ushort *)((long)*ptr + lVar34);
                  *puVar3 = uVar83;
                  puVar3[1] = uVar84;
                  puVar3[2] = uVar85;
                  puVar3[3] = uVar86;
                  puVar3[4] = uVar87;
                  puVar3[5] = uVar88;
                  puVar3[6] = uVar89;
                  puVar3[7] = uVar90;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar34) = auVar63;
                  lVar34 = lVar34 + 0x10;
                  auVar37 = auVar72;
                  auVar82 = auVar67;
                } while (lVar21 != lVar34);
                auVar65._8_8_ = auVar63._8_8_ << 0x10 | (ulong)uVar70;
                uVar1 = uVar31 + 1;
                uVar83 = ptr_00[uVar31 + 1];
                auVar65._0_8_ = auVar63._0_8_ << 0x10 | (ulong)uVar83;
                auVar37 = paddsw((undefined1  [16])*ptr_03,auVar65);
                sVar41 = auVar37._0_2_;
                auVar73._0_2_ =
                     (ushort)((short)auVar72._0_2_ < sVar41) * sVar41 |
                     ((short)auVar72._0_2_ >= sVar41) * auVar72._0_2_;
                sVar41 = auVar37._2_2_;
                auVar73._2_2_ =
                     (ushort)((short)auVar72._2_2_ < sVar41) * sVar41 |
                     ((short)auVar72._2_2_ >= sVar41) * auVar72._2_2_;
                sVar41 = auVar37._4_2_;
                auVar73._4_2_ =
                     (ushort)((short)auVar72._4_2_ < sVar41) * sVar41 |
                     ((short)auVar72._4_2_ >= sVar41) * auVar72._4_2_;
                sVar41 = auVar37._6_2_;
                auVar73._6_2_ =
                     (ushort)((short)auVar72._6_2_ < sVar41) * sVar41 |
                     ((short)auVar72._6_2_ >= sVar41) * auVar72._6_2_;
                sVar41 = auVar37._8_2_;
                auVar73._8_2_ =
                     (ushort)((short)auVar72._8_2_ < sVar41) * sVar41 |
                     ((short)auVar72._8_2_ >= sVar41) * auVar72._8_2_;
                sVar41 = auVar37._10_2_;
                auVar73._10_2_ =
                     (ushort)((short)auVar72._10_2_ < sVar41) * sVar41 |
                     ((short)auVar72._10_2_ >= sVar41) * auVar72._10_2_;
                sVar41 = auVar37._12_2_;
                auVar73._12_2_ =
                     (ushort)((short)auVar72._12_2_ < sVar41) * sVar41 |
                     ((short)auVar72._12_2_ >= sVar41) * auVar72._12_2_;
                sVar41 = auVar37._14_2_;
                auVar73._14_2_ =
                     (ushort)((short)auVar72._14_2_ < sVar41) * sVar41 |
                     ((short)auVar72._14_2_ >= sVar41) * auVar72._14_2_;
                iVar29 = 6;
                do {
                  auVar74._0_8_ = auVar73._0_8_ << 0x10;
                  auVar74._8_8_ = auVar73._8_8_ << 0x10 | auVar73._0_8_ >> 0x30;
                  auVar37 = paddsw(auVar74,auVar44);
                  sVar41 = auVar73._0_2_;
                  sVar71 = auVar37._0_2_;
                  sVar43 = auVar73._2_2_;
                  sVar79 = auVar37._2_2_;
                  sVar46 = auVar73._4_2_;
                  sVar80 = auVar37._4_2_;
                  sVar7 = auVar73._6_2_;
                  sVar81 = auVar37._6_2_;
                  uVar84 = (ushort)(sVar81 < sVar7) * sVar7 | (ushort)(sVar81 >= sVar7) * sVar81;
                  auVar75._0_8_ =
                       CONCAT26(uVar84,CONCAT24((ushort)(sVar80 < sVar46) * sVar46 |
                                                (ushort)(sVar80 >= sVar46) * sVar80,
                                                CONCAT22((ushort)(sVar79 < sVar43) * sVar43 |
                                                         (ushort)(sVar79 >= sVar43) * sVar79,
                                                         (ushort)(sVar71 < sVar41) * sVar41 |
                                                         (ushort)(sVar71 >= sVar41) * sVar71)));
                  sVar41 = auVar73._8_2_;
                  sVar43 = auVar37._8_2_;
                  auVar75._8_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar73._10_2_;
                  sVar43 = auVar37._10_2_;
                  auVar75._10_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar73._12_2_;
                  sVar43 = auVar37._12_2_;
                  sVar46 = auVar37._14_2_;
                  auVar75._12_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar73._14_2_;
                  auVar75._14_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  iVar29 = iVar29 + -1;
                  auVar73 = auVar75;
                } while (iVar29 != 0);
                auVar76._0_8_ = auVar75._0_8_ << 0x10;
                auVar76._8_8_ = auVar75._8_8_ << 0x10 | (ulong)uVar84;
                auVar77 = paddsw(auVar76,ZEXT416(uVar17 & 0xffff));
                sVar41 = auVar77._0_2_;
                auVar66._0_2_ =
                     (ushort)((short)uVar83 < sVar41) * sVar41 | ((short)uVar83 >= sVar41) * uVar83;
                sVar41 = auVar77._2_2_;
                auVar66._2_2_ =
                     (ushort)((short)uVar62 < sVar41) * sVar41 | ((short)uVar62 >= sVar41) * uVar62;
                sVar41 = auVar77._4_2_;
                auVar66._4_2_ =
                     (ushort)((short)uVar68 < sVar41) * sVar41 | ((short)uVar68 >= sVar41) * uVar68;
                sVar41 = auVar77._6_2_;
                auVar66._6_2_ =
                     (ushort)((short)uVar69 < sVar41) * sVar41 | ((short)uVar69 >= sVar41) * uVar69;
                sVar41 = auVar77._8_2_;
                auVar66._8_2_ =
                     (ushort)((short)uVar70 < sVar41) * sVar41 | ((short)uVar70 >= sVar41) * uVar70;
                sVar41 = auVar77._10_2_;
                auVar66._10_2_ =
                     (ushort)((short)auVar63._8_2_ < sVar41) * sVar41 |
                     ((short)auVar63._8_2_ >= sVar41) * auVar63._8_2_;
                sVar41 = auVar77._12_2_;
                auVar66._12_2_ =
                     (ushort)((short)auVar63._10_2_ < sVar41) * sVar41 |
                     ((short)auVar63._10_2_ >= sVar41) * auVar63._10_2_;
                sVar41 = auVar77._14_2_;
                auVar66._14_2_ =
                     (ushort)((short)auVar63._12_2_ < sVar41) * sVar41 |
                     ((short)auVar63._12_2_ >= sVar41) * auVar63._12_2_;
                lVar22 = 0;
                lVar34 = lVar26;
                auVar37 = auVar51;
                do {
                  auVar9._4_4_ = uVar36;
                  auVar9._0_4_ = uVar36;
                  auVar9._8_4_ = uVar36;
                  auVar9._12_4_ = uVar36;
                  auVar64 = psubsw(auVar77,auVar9);
                  auVar67 = psubsw(auVar66,auVar47);
                  sVar41 = auVar67._0_2_;
                  sVar43 = auVar64._0_2_;
                  auVar77._0_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar67._2_2_;
                  sVar43 = auVar64._2_2_;
                  auVar77._2_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar67._4_2_;
                  sVar43 = auVar64._4_2_;
                  auVar77._4_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar67._6_2_;
                  sVar43 = auVar64._6_2_;
                  auVar77._6_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar67._8_2_;
                  sVar43 = auVar64._8_2_;
                  auVar77._8_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar67._10_2_;
                  sVar43 = auVar64._10_2_;
                  auVar77._10_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar67._12_2_;
                  sVar43 = auVar64._12_2_;
                  sVar46 = auVar64._14_2_;
                  auVar77._12_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar67._14_2_;
                  auVar77._14_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  psVar2 = (short *)((long)*ptr_01 + lVar22);
                  sVar41 = *psVar2;
                  sVar43 = psVar2[1];
                  sVar46 = psVar2[2];
                  sVar7 = psVar2[3];
                  sVar71 = psVar2[4];
                  sVar79 = psVar2[5];
                  sVar80 = psVar2[6];
                  sVar81 = psVar2[7];
                  auVar66._0_2_ =
                       (sVar41 < (short)auVar77._0_2_) * auVar77._0_2_ |
                       (ushort)(sVar41 >= (short)auVar77._0_2_) * sVar41;
                  auVar66._2_2_ =
                       (sVar43 < (short)auVar77._2_2_) * auVar77._2_2_ |
                       (ushort)(sVar43 >= (short)auVar77._2_2_) * sVar43;
                  auVar66._4_2_ =
                       (sVar46 < (short)auVar77._4_2_) * auVar77._4_2_ |
                       (ushort)(sVar46 >= (short)auVar77._4_2_) * sVar46;
                  auVar66._6_2_ =
                       (sVar7 < (short)auVar77._6_2_) * auVar77._6_2_ |
                       (ushort)(sVar7 >= (short)auVar77._6_2_) * sVar7;
                  auVar66._8_2_ =
                       (sVar71 < (short)auVar77._8_2_) * auVar77._8_2_ |
                       (ushort)(sVar71 >= (short)auVar77._8_2_) * sVar71;
                  auVar66._10_2_ =
                       (sVar79 < (short)auVar77._10_2_) * auVar77._10_2_ |
                       (ushort)(sVar79 >= (short)auVar77._10_2_) * sVar79;
                  auVar66._12_2_ =
                       (sVar80 < (short)auVar77._12_2_) * auVar77._12_2_ |
                       (ushort)(sVar80 >= (short)auVar77._12_2_) * sVar80;
                  auVar66._14_2_ =
                       (sVar81 < (short)auVar77._14_2_) * auVar77._14_2_ |
                       (ushort)(sVar81 >= (short)auVar77._14_2_) * sVar81;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar22) = auVar66;
                  piVar6 = ((ppVar16->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + lVar34) = (int)(short)auVar66._0_2_;
                  *(int *)((long)piVar6 + lVar32 * 4 + lVar34) = (int)(short)auVar66._2_2_;
                  *(int *)((long)piVar6 + lVar32 * 8 + lVar34) = (int)(short)auVar66._4_2_;
                  *(int *)((long)piVar6 + lVar32 * 0xc + lVar34) = (int)(short)auVar66._6_2_;
                  *(int *)((long)piVar6 + lVar32 * 0x10 + lVar34) = (int)(short)auVar66._8_2_;
                  *(int *)((long)piVar6 + lVar32 * 0x14 + lVar34) = (int)(short)auVar66._10_2_;
                  *(int *)((long)piVar6 + lVar32 * 0x18 + lVar34) = (int)(short)auVar66._12_2_;
                  *(int *)((long)piVar6 + lVar32 * 0x1c + lVar34) = (int)(short)auVar66._14_2_;
                  sVar41 = auVar45._0_2_;
                  uVar62 = ((short)auVar77._0_2_ < sVar41) * auVar77._0_2_ |
                           (ushort)((short)auVar77._0_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._2_2_;
                  uVar68 = ((short)auVar77._2_2_ < sVar41) * auVar77._2_2_ |
                           (ushort)((short)auVar77._2_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._4_2_;
                  uVar69 = ((short)auVar77._4_2_ < sVar41) * auVar77._4_2_ |
                           (ushort)((short)auVar77._4_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._6_2_;
                  uVar70 = ((short)auVar77._6_2_ < sVar41) * auVar77._6_2_ |
                           (ushort)((short)auVar77._6_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._8_2_;
                  uVar83 = ((short)auVar77._8_2_ < sVar41) * auVar77._8_2_ |
                           (ushort)((short)auVar77._8_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._10_2_;
                  uVar84 = ((short)auVar77._10_2_ < sVar41) * auVar77._10_2_ |
                           (ushort)((short)auVar77._10_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._12_2_;
                  sVar43 = auVar45._14_2_;
                  uVar85 = ((short)auVar77._12_2_ < sVar41) * auVar77._12_2_ |
                           (ushort)((short)auVar77._12_2_ >= sVar41) * sVar41;
                  uVar86 = ((short)auVar77._14_2_ < sVar43) * auVar77._14_2_ |
                           (ushort)((short)auVar77._14_2_ >= sVar43) * sVar43;
                  auVar45._0_2_ =
                       ((short)auVar66._0_2_ < (short)uVar62) * auVar66._0_2_ |
                       ((short)auVar66._0_2_ >= (short)uVar62) * uVar62;
                  auVar45._2_2_ =
                       ((short)auVar66._2_2_ < (short)uVar68) * auVar66._2_2_ |
                       ((short)auVar66._2_2_ >= (short)uVar68) * uVar68;
                  auVar45._4_2_ =
                       ((short)auVar66._4_2_ < (short)uVar69) * auVar66._4_2_ |
                       ((short)auVar66._4_2_ >= (short)uVar69) * uVar69;
                  auVar45._6_2_ =
                       ((short)auVar66._6_2_ < (short)uVar70) * auVar66._6_2_ |
                       ((short)auVar66._6_2_ >= (short)uVar70) * uVar70;
                  auVar45._8_2_ =
                       ((short)auVar66._8_2_ < (short)uVar83) * auVar66._8_2_ |
                       ((short)auVar66._8_2_ >= (short)uVar83) * uVar83;
                  auVar45._10_2_ =
                       ((short)auVar66._10_2_ < (short)uVar84) * auVar66._10_2_ |
                       ((short)auVar66._10_2_ >= (short)uVar84) * uVar84;
                  auVar45._12_2_ =
                       ((short)auVar66._12_2_ < (short)uVar85) * auVar66._12_2_ |
                       ((short)auVar66._12_2_ >= (short)uVar85) * uVar85;
                  auVar45._14_2_ =
                       ((short)auVar66._14_2_ < (short)uVar86) * auVar66._14_2_ |
                       ((short)auVar66._14_2_ >= (short)uVar86) * uVar86;
                  sVar41 = auVar37._0_2_;
                  auVar51._0_2_ =
                       (sVar41 < (short)auVar66._0_2_) * auVar66._0_2_ |
                       (ushort)(sVar41 >= (short)auVar66._0_2_) * sVar41;
                  sVar41 = auVar37._2_2_;
                  auVar51._2_2_ =
                       (sVar41 < (short)auVar66._2_2_) * auVar66._2_2_ |
                       (ushort)(sVar41 >= (short)auVar66._2_2_) * sVar41;
                  sVar41 = auVar37._4_2_;
                  auVar51._4_2_ =
                       (sVar41 < (short)auVar66._4_2_) * auVar66._4_2_ |
                       (ushort)(sVar41 >= (short)auVar66._4_2_) * sVar41;
                  sVar41 = auVar37._6_2_;
                  auVar51._6_2_ =
                       (sVar41 < (short)auVar66._6_2_) * auVar66._6_2_ |
                       (ushort)(sVar41 >= (short)auVar66._6_2_) * sVar41;
                  sVar41 = auVar37._8_2_;
                  auVar51._8_2_ =
                       (sVar41 < (short)auVar66._8_2_) * auVar66._8_2_ |
                       (ushort)(sVar41 >= (short)auVar66._8_2_) * sVar41;
                  sVar41 = auVar37._10_2_;
                  auVar51._10_2_ =
                       (sVar41 < (short)auVar66._10_2_) * auVar66._10_2_ |
                       (ushort)(sVar41 >= (short)auVar66._10_2_) * sVar41;
                  sVar41 = auVar37._12_2_;
                  sVar43 = auVar37._14_2_;
                  auVar51._12_2_ =
                       (sVar41 < (short)auVar66._12_2_) * auVar66._12_2_ |
                       (ushort)(sVar41 >= (short)auVar66._12_2_) * sVar41;
                  auVar51._14_2_ =
                       (sVar43 < (short)auVar66._14_2_) * auVar66._14_2_ |
                       (ushort)(sVar43 >= (short)auVar66._14_2_) * sVar43;
                  lVar22 = lVar22 + 0x10;
                  lVar34 = lVar34 + uVar27 * 4;
                  auVar37 = auVar51;
                } while (lVar21 != lVar22);
                sVar41 = (short)(*palVar20)[0];
                sVar43 = *(short *)((long)*palVar20 + 2);
                sVar46 = *(short *)((long)*palVar20 + 4);
                sVar7 = *(short *)((long)*palVar20 + 6);
                sVar71 = (short)(*palVar20)[1];
                sVar79 = *(short *)((long)*palVar20 + 10);
                sVar80 = *(short *)((long)*palVar20 + 0xc);
                sVar81 = *(short *)((long)*palVar20 + 0xe);
                sVar52 = auVar53._0_2_;
                auVar78._0_2_ = -(ushort)(sVar52 < sVar41);
                sVar55 = auVar53._2_2_;
                auVar78._2_2_ = -(ushort)(sVar55 < sVar43);
                sVar56 = auVar53._4_2_;
                auVar78._4_2_ = -(ushort)(sVar56 < sVar46);
                sVar57 = auVar53._6_2_;
                auVar78._6_2_ = -(ushort)(sVar57 < sVar7);
                sVar58 = auVar53._8_2_;
                auVar78._8_2_ = -(ushort)(sVar58 < sVar71);
                sVar59 = auVar53._10_2_;
                auVar78._10_2_ = -(ushort)(sVar59 < sVar79);
                sVar60 = auVar53._12_2_;
                auVar78._12_2_ = -(ushort)(sVar60 < sVar80);
                sVar61 = auVar53._14_2_;
                auVar78._14_2_ = -(ushort)(sVar61 < sVar81);
                auVar10._2_2_ = -(ushort)(sVar35 == 6);
                auVar10._0_2_ = -(ushort)(sVar49 == 7);
                auVar10._4_2_ = -(ushort)(sVar49 == 5);
                auVar10._6_2_ = -(ushort)(sVar35 == 4);
                auVar10._8_2_ = -(ushort)(sVar49 == 3);
                auVar10._10_2_ = -(ushort)(sVar35 == 2);
                auVar10._12_2_ = -(ushort)(sVar49 == 1);
                auVar10._14_2_ = -(ushort)(sVar35 == 0);
                auVar78 = auVar78 & auVar10;
                local_110 = (int)uVar31;
                if ((((((((((((((((auVar78 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar78 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar78 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar78 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar78 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar78 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar78 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar78 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar78 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar78 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar78 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar78 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar78[0xf] < '\0') {
                  local_124 = local_110;
                }
                auVar53._0_2_ =
                     (ushort)(sVar52 < sVar41) * sVar41 | (ushort)(sVar52 >= sVar41) * sVar52;
                auVar53._2_2_ =
                     (ushort)(sVar55 < sVar43) * sVar43 | (ushort)(sVar55 >= sVar43) * sVar55;
                auVar53._4_2_ =
                     (ushort)(sVar56 < sVar46) * sVar46 | (ushort)(sVar56 >= sVar46) * sVar56;
                auVar53._6_2_ =
                     (ushort)(sVar57 < sVar7) * sVar7 | (ushort)(sVar57 >= sVar7) * sVar57;
                auVar53._8_2_ =
                     (ushort)(sVar58 < sVar71) * sVar71 | (ushort)(sVar58 >= sVar71) * sVar58;
                auVar53._10_2_ =
                     (ushort)(sVar59 < sVar79) * sVar79 | (ushort)(sVar59 >= sVar79) * sVar59;
                auVar53._12_2_ =
                     (ushort)(sVar60 < sVar80) * sVar80 | (ushort)(sVar60 >= sVar80) * sVar60;
                auVar53._14_2_ =
                     (ushort)(sVar61 < sVar81) * sVar81 | (ushort)(sVar61 >= sVar81) * sVar61;
                lVar26 = lVar26 + 4;
                uVar31 = uVar1;
              } while (uVar1 != uVar30);
              if (s2_end != 0) {
                if (iVar13 < 7) {
                  auVar37 = auVar53;
                  uVar17 = 1;
                  if (1 < (int)uVar15) {
                    uVar17 = uVar15;
                  }
                  do {
                    auVar54._0_8_ = auVar37._0_8_ << 0x10;
                    auVar54._8_8_ = auVar37._8_8_ << 0x10 | auVar37._0_8_ >> 0x30;
                    auVar53._14_2_ = auVar37._12_2_;
                    uVar17 = uVar17 - 1;
                    auVar37 = auVar54;
                  } while (uVar17 != 0);
                }
                uVar17 = (uint)auVar53._14_2_;
              }
              sVar49 = (short)uVar17;
              iVar29 = iVar12;
              if ((s1_end != 0) && ((uVar48 & 0x7ffffff8) != 0)) {
                uVar27 = 0;
                do {
                  iVar28 = ((uint)uVar27 & 7) * uVar24 + ((uint)(uVar27 >> 3) & 0x1fffffff);
                  if (iVar28 < (int)uVar18) {
                    auVar53._14_2_ = *(ushort *)((long)*ptr_02 + uVar27 * 2);
                    if ((short)(ushort)uVar17 < (short)auVar53._14_2_) {
                      uVar17 = (uint)auVar53._14_2_;
                      iVar29 = iVar28;
                      local_124 = iVar14;
                    }
                    else {
                      if (iVar29 <= iVar28) {
                        iVar28 = iVar29;
                      }
                      if (local_124 != iVar14) {
                        iVar28 = iVar29;
                      }
                      if (auVar53._14_2_ == (ushort)uVar17) {
                        iVar29 = iVar28;
                      }
                    }
                  }
                  sVar49 = (short)uVar17;
                  uVar27 = uVar27 + 1;
                } while ((uVar24 & 0xfffffff) << 3 != (int)uVar27);
              }
              if (s2_end == 0 && s1_end == 0) {
                uVar27 = ptr_02[(uint)(iVar12 % (int)uVar24)][0];
                uVar48 = ptr_02[(uint)(iVar12 % (int)uVar24)][1];
                if (iVar13 < 7) {
                  uVar18 = 1;
                  if (1 < (int)uVar15) {
                    uVar18 = uVar15;
                  }
                  do {
                    uVar48 = uVar48 << 0x10 | uVar27 >> 0x30;
                    uVar18 = uVar18 - 1;
                    uVar27 = uVar27 << 0x10;
                  } while (uVar18 != 0);
                }
                sVar49 = (short)(uVar48 >> 0x30);
                iVar29 = iVar12;
                local_124 = iVar14;
              }
              sVar35 = auVar38._0_2_;
              auVar40._0_2_ = -(ushort)((short)auVar45._0_2_ < sVar35);
              sVar41 = auVar38._2_2_;
              auVar40._2_2_ = -(ushort)((short)auVar45._2_2_ < sVar41);
              auVar40._4_2_ = -(ushort)((short)auVar45._4_2_ < sVar35);
              auVar40._6_2_ = -(ushort)((short)auVar45._6_2_ < sVar41);
              auVar40._8_2_ = -(ushort)((short)auVar45._8_2_ < sVar35);
              auVar40._10_2_ = -(ushort)((short)auVar45._10_2_ < sVar41);
              auVar40._12_2_ = -(ushort)((short)auVar45._12_2_ < sVar35);
              auVar40._14_2_ = -(ushort)((short)auVar45._14_2_ < sVar41);
              sVar35 = auVar42._0_2_;
              auVar38._0_2_ = -(ushort)(sVar35 < (short)auVar51._0_2_);
              sVar41 = auVar42._2_2_;
              auVar38._2_2_ = -(ushort)(sVar41 < (short)auVar51._2_2_);
              auVar38._4_2_ = -(ushort)(sVar35 < (short)auVar51._4_2_);
              auVar38._6_2_ = -(ushort)(sVar41 < (short)auVar51._6_2_);
              auVar38._8_2_ = -(ushort)(sVar35 < (short)auVar51._8_2_);
              auVar38._10_2_ = -(ushort)(sVar41 < (short)auVar51._10_2_);
              auVar38._12_2_ = -(ushort)(sVar35 < (short)auVar51._12_2_);
              auVar38._14_2_ = -(ushort)(sVar41 < (short)auVar51._14_2_);
              auVar38 = auVar38 | auVar40;
              if ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar38 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar38 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar38 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar38 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar38 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar38 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar38 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar38 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar38 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar38 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar38 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar38[0xf] < '\0') {
                *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                sVar49 = 0;
                local_124 = 0;
                iVar29 = 0;
              }
              ppVar16->score = (int)sVar49;
              ppVar16->end_query = iVar29;
              ppVar16->end_ref = local_124;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar16;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}